

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall
AGSMock::MockEngine::RegisterScriptFunction(MockEngine *this,char *name,void *address)

{
  Data *pDVar1;
  mapped_type *ppvVar2;
  allocator<char> local_41;
  key_type local_40;
  void *local_20;
  void *address_local;
  char *name_local;
  MockEngine *this_local;
  
  pDVar1 = this->data_;
  local_20 = address;
  address_local = name;
  name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,name,&local_41);
  ppvVar2 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::operator[](&pDVar1->functions,&local_40);
  *ppvVar2 = address;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void MockEngine::RegisterScriptFunction(const char *name, void *address)
{
	data_->functions[name] = address;
}